

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O2

void __thiscall
bsplib::Rdma::hpput(Rdma *this,void *src,int dst_pid,Memslot dst_slot,size_t dst_offset,size_t size)

{
  pointer ppvVar1;
  pointer ppvVar2;
  ssize_t sVar3;
  int __flags;
  Action action;
  
  __flags = (int)dst_offset;
  if (size < this->m_min_n_hp_msg_size) {
    put(this,src,dst_pid,dst_slot,dst_offset,size);
    return;
  }
  if (((this->m_used_slots).
       super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>._M_impl.
       super__Vector_impl_data._M_start[(long)this->m_nprocs * dst_slot + (long)this->m_pid].status
      & 1) == 0) {
    ppvVar1 = (this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppvVar2 = (this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    action._0_8_ = src;
    std::vector<void*,std::allocator<void*>>::emplace_back<void*>
              ((vector<void*,std::allocator<void*>> *)&this->m_local_slots,(void **)&action);
    sVar3 = Unbuf::send(&this->m_unbuf,dst_pid,src,size,__flags);
    action.target_pid = dst_pid;
    action.kind = HPPUT;
    action.src_pid = this->m_pid;
    action.tag = (int)sVar3;
    action.dst_pid = dst_pid;
    action.src_slot = (long)ppvVar1 - (long)ppvVar2 >> 3;
    action.dst_slot = dst_slot;
    action.offset = dst_offset;
    action.size = size;
    ActionBuf::push_back(&this->m_send_actions,&action);
    return;
  }
  __assert_fail("! (slot( m_pid, dst_slot ).status & Memblock::PUSHED)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                ,0x68,"void bsplib::Rdma::hpput(const void *, int, Memslot, size_t, size_t)");
}

Assistant:

void Rdma::hpput( const void * src,
        int dst_pid, Memslot dst_slot, size_t dst_offset, size_t size )
{
#ifdef PROFILE
    TicToc t( TicToc::HPPUT );
#endif
    if ( size < m_min_n_hp_msg_size ) { 
        put( src, dst_pid, dst_slot, dst_offset, size );
        return;
    }

    assert( ! (slot( m_pid, dst_slot ).status & Memblock::PUSHED) );
    
    Memslot src_slot = m_local_slots.size();
    m_local_slots.push_back( const_cast<void *>(src) );

    int tag = m_unbuf.send( dst_pid, src, size );

    Action action = { Action::HPPUT, dst_pid, m_pid, dst_pid,
                      tag, src_slot, dst_slot , dst_offset, size };
    m_send_actions.push_back( action );
}